

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O0

Pdr_Man_t * Pdr_ManStart(Aig_Man_t *pAig,Pdr_Par_t *pPars,Vec_Int_t *vPrioInit)

{
  int iVar1;
  uint n;
  Pdr_Man_t *pMan;
  Vec_Ptr_t *pVVar2;
  Vec_Vec_t *pVVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  Vec_Wec_t *pVVar6;
  Cnf_Man_t *pCVar7;
  uint *puVar8;
  abctime *paVar9;
  Txs3_Man_t *local_40;
  Gia_Man_t *local_38;
  int local_2c;
  int i;
  Pdr_Man_t *p;
  Vec_Int_t *vPrioInit_local;
  Pdr_Par_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  pMan = (Pdr_Man_t *)calloc(1,0x1d0);
  pMan->pPars = pPars;
  pMan->pAig = pAig;
  if (((pPars->fFlopPrio == 0) && (pMan->pPars->fNewXSim == 0)) && (pMan->pPars->fUseAbs == 0)) {
    local_38 = (Gia_Man_t *)0x0;
  }
  else {
    local_38 = Gia_ManFromAigSimple(pAig);
  }
  pMan->pGia = local_38;
  pVVar2 = Vec_PtrAlloc(0);
  pMan->vSolvers = pVVar2;
  pVVar3 = Vec_VecAlloc(0);
  pMan->vClauses = pVVar3;
  pMan->pQueue = (Pdr_Obl_t *)0x0;
  iVar1 = Aig_ManRegNum(pAig);
  piVar4 = (int *)malloc((long)iVar1 << 2);
  pMan->pOrder = piVar4;
  pVVar5 = Vec_IntAlloc(0x100);
  pMan->vActVars = pVVar5;
  if (pMan->pPars->fMonoCnf == 0) {
    iVar1 = Aig_ManLevels(pAig);
    iVar1 = Abc_MaxInt(1,iVar1);
    pVVar6 = Vec_WecStart(iVar1 + 1);
    pMan->vVLits = pVVar6;
  }
  n = Aig_ManRegNum(pAig);
  iVar1 = Abc_Base2Log(n);
  pMan->nPrioShift = iVar1;
  if (vPrioInit == (Vec_Int_t *)0x0) {
    if (pPars->fFlopPrio == 0) {
      iVar1 = Aig_ManRegNum(pAig);
      pVVar5 = Vec_IntStart(iVar1);
      pMan->vPrio = pVVar5;
    }
    else {
      pVVar5 = Pdr_ManDeriveFlopPriorities2(pMan->pGia,1);
      pMan->vPrio = pVVar5;
    }
  }
  else {
    pMan->vPrio = vPrioInit;
  }
  pVVar5 = Vec_IntAlloc(100);
  pMan->vLits = pVVar5;
  pVVar5 = Vec_IntAlloc(100);
  pMan->vCiObjs = pVVar5;
  pVVar5 = Vec_IntAlloc(100);
  pMan->vCoObjs = pVVar5;
  pVVar5 = Vec_IntAlloc(100);
  pMan->vCiVals = pVVar5;
  pVVar5 = Vec_IntAlloc(100);
  pMan->vCoVals = pVVar5;
  pVVar5 = Vec_IntAlloc(100);
  pMan->vNodes = pVVar5;
  pVVar5 = Vec_IntAlloc(100);
  pMan->vUndo = pVVar5;
  pVVar5 = Vec_IntAlloc(100);
  pMan->vVisits = pVVar5;
  pVVar5 = Vec_IntAlloc(100);
  pMan->vCi2Rem = pVVar5;
  pVVar5 = Vec_IntAlloc(100);
  pMan->vRes = pVVar5;
  pCVar7 = Cnf_ManStart();
  pMan->pCnfMan = pCVar7;
  if (pPars->fNewXSim == 0) {
    local_40 = (Txs3_Man_t *)0x0;
  }
  else {
    local_40 = Txs3_ManStart(pMan,pAig,pMan->vPrio);
  }
  pMan->pTxs3 = local_40;
  if (pAig->pFanData == (int *)0x0) {
    Aig_ManFanoutStart(pAig);
  }
  if (pAig->pTerSimData == (uint *)0x0) {
    iVar1 = Aig_ManObjNumMax(pAig);
    puVar8 = (uint *)calloc((long)(iVar1 / 0x10 + 1),4);
    pAig->pTerSimData = puVar8;
  }
  if (pPars->nTimeOutOne != 0) {
    iVar1 = Saig_ManPoNum(pAig);
    paVar9 = (abctime *)malloc((long)iVar1 << 3);
    pMan->pTime4Outs = paVar9;
    for (local_2c = 0; iVar1 = Saig_ManPoNum(pAig), local_2c < iVar1; local_2c = local_2c + 1) {
      pMan->pTime4Outs[local_2c] = ((long)pPars->nTimeOutOne * 1000000) / 1000 + 1;
    }
  }
  if (pPars->fSolveAll != 0) {
    iVar1 = Saig_ManPoNum(pMan->pAig);
    pVVar2 = Vec_PtrStart(iVar1);
    pMan->vCexes = pVVar2;
    iVar1 = Saig_ManPoNum(pAig);
    pVVar5 = Vec_IntAlloc(iVar1);
    pMan->pPars->vOutMap = pVVar5;
    pVVar5 = pMan->pPars->vOutMap;
    iVar1 = Saig_ManPoNum(pAig);
    Vec_IntFill(pVVar5,iVar1,-2);
  }
  return pMan;
}

Assistant:

Pdr_Man_t * Pdr_ManStart( Aig_Man_t * pAig, Pdr_Par_t * pPars, Vec_Int_t * vPrioInit )
{
    Pdr_Man_t * p;
    p = ABC_CALLOC( Pdr_Man_t, 1 );
    p->pPars    = pPars;
    p->pAig     = pAig;
    p->pGia     = (pPars->fFlopPrio || p->pPars->fNewXSim || p->pPars->fUseAbs) ? Gia_ManFromAigSimple(pAig) : NULL;
    p->vSolvers = Vec_PtrAlloc( 0 );
    p->vClauses = Vec_VecAlloc( 0 );
    p->pQueue   = NULL;
    p->pOrder   = ABC_ALLOC( int, Aig_ManRegNum(pAig) );
    p->vActVars = Vec_IntAlloc( 256 );
    if ( !p->pPars->fMonoCnf )
        p->vVLits   = Vec_WecStart( 1+Abc_MaxInt(1, Aig_ManLevels(pAig)) );
    // internal use
    p->nPrioShift = Abc_Base2Log(Aig_ManRegNum(pAig));
    if ( vPrioInit )
        p->vPrio = vPrioInit;
    else if ( pPars->fFlopPrio )
        p->vPrio = Pdr_ManDeriveFlopPriorities2(p->pGia, 1);
//    else if ( p->pPars->fNewXSim )
//        p->vPrio = Vec_IntStartNatural( Aig_ManRegNum(pAig) );
    else 
        p->vPrio = Vec_IntStart( Aig_ManRegNum(pAig) );
    p->vLits    = Vec_IntAlloc( 100 );  // array of literals
    p->vCiObjs  = Vec_IntAlloc( 100 );  // cone leaves
    p->vCoObjs  = Vec_IntAlloc( 100 );  // cone roots
    p->vCiVals  = Vec_IntAlloc( 100 );  // cone leaf values
    p->vCoVals  = Vec_IntAlloc( 100 );  // cone root values
    p->vNodes   = Vec_IntAlloc( 100 );  // cone nodes
    p->vUndo    = Vec_IntAlloc( 100 );  // cone undos
    p->vVisits  = Vec_IntAlloc( 100 );  // intermediate
    p->vCi2Rem  = Vec_IntAlloc( 100 );  // CIs to be removed
    p->vRes     = Vec_IntAlloc( 100 );  // final result
    p->pCnfMan  = Cnf_ManStart();
    // ternary simulation
    p->pTxs3    = pPars->fNewXSim ? Txs3_ManStart( p, pAig, p->vPrio ) : NULL;
    // additional AIG data-members
    if ( pAig->pFanData == NULL )
        Aig_ManFanoutStart( pAig );
    if ( pAig->pTerSimData == NULL )
        pAig->pTerSimData = ABC_CALLOC( unsigned, 1 + (Aig_ManObjNumMax(pAig) / 16) );
    // time spent on each outputs
    if ( pPars->nTimeOutOne )
    {
        int i;
        p->pTime4Outs = ABC_ALLOC( abctime, Saig_ManPoNum(pAig) );
        for ( i = 0; i < Saig_ManPoNum(pAig); i++ )
            p->pTime4Outs[i] = pPars->nTimeOutOne * CLOCKS_PER_SEC / 1000 + 1;
    }
    if ( pPars->fSolveAll )
    {
        p->vCexes = Vec_PtrStart( Saig_ManPoNum(p->pAig) );
        p->pPars->vOutMap = Vec_IntAlloc( Saig_ManPoNum(pAig) );
        Vec_IntFill( p->pPars->vOutMap, Saig_ManPoNum(pAig), -2 );
    }
    return p;
}